

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyKeyIDs.h
# Opt level: O0

void __thiscall
llbuild::core::DependencyKeyIDs::append(DependencyKeyIDs *this,DependencyKeyIDs *rhs)

{
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  const_iterator local_48;
  KeyID *local_40;
  KeyID *local_38;
  __normal_iterator<const_llbuild::core::KeyID_*,_std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>_>
  local_30;
  __normal_iterator<llbuild::core::KeyID_*,_std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>_>
  local_28;
  const_iterator local_20;
  DependencyKeyIDs *local_18;
  DependencyKeyIDs *rhs_local;
  DependencyKeyIDs *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  local_28._M_current =
       (KeyID *)std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::end
                          (&this->keys);
  __gnu_cxx::
  __normal_iterator<llbuild::core::KeyID_const*,std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>>
  ::__normal_iterator<llbuild::core::KeyID*>
            ((__normal_iterator<llbuild::core::KeyID_const*,std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>>
              *)&local_20,&local_28);
  local_30._M_current =
       (KeyID *)std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::begin
                          (&local_18->keys);
  local_38 = (KeyID *)std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::end
                                (&local_18->keys);
  local_40 = (KeyID *)std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>::
                      insert<__gnu_cxx::__normal_iterator<llbuild::core::KeyID_const*,std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>>,void>
                                ((vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>
                                  *)this,local_20,local_30,
                                 (__normal_iterator<const_llbuild::core::KeyID_*,_std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>_>
                                  )local_38);
  local_50._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->flags);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_48,&local_50);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_18->flags);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&local_18->flags);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->flags,local_48,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current);
  return;
}

Assistant:

void append(const DependencyKeyIDs &rhs) {
    keys.insert(keys.end(), rhs.keys.begin(), rhs.keys.end());
    flags.insert(flags.end(), rhs.flags.begin(), rhs.flags.end());
  }